

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::SerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,uint8 *target)

{
  size_t sVar1;
  uint8 *puVar2;
  EpsCopyOutputStream stream;
  EpsCopyOutputStream local_50;
  
  sVar1 = MessageSetByteSize(this);
  local_50.end_ = target + (int)sVar1;
  local_50.buffer_end_ = (uint8 *)0x0;
  local_50.is_serialization_deterministic_ =
       (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  local_50.stream_ = (ZeroCopyOutputStream *)0x0;
  local_50.had_error_ = false;
  local_50.aliasing_enabled_ = false;
  puVar2 = InternalSerializeMessageSetWithCachedSizesToArray(this,target,&local_50);
  return puVar2;
}

Assistant:

uint8* ExtensionSet::SerializeMessageSetWithCachedSizesToArray(
    uint8* target) const {
  io::EpsCopyOutputStream stream(
      target, MessageSetByteSize(),
      io::CodedOutputStream::IsDefaultSerializationDeterministic());
  return InternalSerializeMessageSetWithCachedSizesToArray(target, &stream);
}